

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void __thiscall Arbiter_Time_Test::TestBody(Arbiter_Time_Test *this)

{
  long lVar1;
  char *pcVar2;
  AssertHelper local_d0 [4];
  Time epoch;
  AssertionResult gtest_ar_1;
  Time t;
  allocator local_79;
  AssertHelper local_78;
  int64_t delta;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Time x;
  Time a;
  Time b;
  Time y;
  
  arbiter::Time::Time(&a);
  std::__cxx11::string::string((string *)local_d0,"%Y-%m-%dT%H:%M:%SZ",(allocator *)&y);
  arbiter::Time::str((string *)&gtest_ar_1);
  std::__cxx11::string::string((string *)&x,"%Y-%m-%dT%H:%M:%SZ",(allocator *)&delta);
  arbiter::Time::Time(&b,(string *)&gtest_ar_1,(string *)&x);
  std::__cxx11::string::~string((string *)&x);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::string((string *)local_d0,"%Y-%m-%dT%H:%M:%SZ",(allocator *)&epoch);
  arbiter::Time::str((string *)&gtest_ar_1);
  std::__cxx11::string::string((string *)&y,"%Y-%m-%dT%H:%M:%SZ",(allocator *)&t);
  arbiter::Time::str((string *)&x);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&delta,"a.str()","b.str()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x);
  std::__cxx11::string::~string((string *)&x);
  std::__cxx11::string::~string((string *)&y);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)local_d0);
  if ((char)delta == '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_68.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_68.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=(local_d0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_68);
  local_d0[0].data_ = (AssertHelperData *)arbiter::Time::operator-(&a,&b);
  _x = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_1,"a - b","0",(long *)local_d0,(int *)&x);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&x,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&x,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&x);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::string((string *)&gtest_ar_1,"2016-03-18T03:14:42Z",(allocator *)&y);
  std::__cxx11::string::string((string *)local_d0,"%Y-%m-%dT%H:%M:%SZ",(allocator *)&delta);
  arbiter::Time::Time(&x,(string *)&gtest_ar_1,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::string((string *)&gtest_ar_1,"2016-03-18T04:24:54Z",(allocator *)&delta);
  std::__cxx11::string::string((string *)local_d0,"%Y-%m-%dT%H:%M:%SZ",(allocator *)&epoch);
  arbiter::Time::Time(&y,(string *)&gtest_ar_1,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  delta = 0x1074;
  local_d0[0].data_ = (AssertHelperData *)arbiter::Time::operator-(&y,&x);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_1,"y - x","delta",(long *)local_d0,&delta);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&epoch,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&epoch,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&epoch);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  local_d0[0].data_ = (AssertHelperData *)arbiter::Time::operator-(&x,&y);
  _epoch = 0xffffffffffffef8c;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_1,"x - y","-delta",(long *)local_d0,(long *)&epoch);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&epoch,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&epoch,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&epoch);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::string((string *)&gtest_ar_1,"1970-01-01T00:00:00Z",(allocator *)&t);
  std::__cxx11::string::string((string *)local_d0,"%Y-%m-%dT%H:%M:%SZ",(allocator *)&local_78);
  arbiter::Time::Time(&epoch,(string *)&gtest_ar_1,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  local_d0[0].data_ = (AssertHelperData *)arbiter::Time::asUnix();
  _t = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_1,"epoch.asUnix()","0",(long *)local_d0,(int *)&t);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&t,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x2f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&t,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&t);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::string((string *)&gtest_ar_1,"2019-01-03T17:39:11Z",(allocator *)&local_78);
  std::__cxx11::string::string((string *)local_d0,"%Y-%m-%dT%H:%M:%SZ",&local_79);
  arbiter::Time::Time(&t,(string *)&gtest_ar_1,(string *)local_d0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  lVar1 = arbiter::Time::asUnix();
  local_d0[0].data_ = (AssertHelperData *)(lVar1 + -0x5c2e48bf);
  local_78.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar_1,"t.asUnix() - 1546537151","0",(long *)local_d0,(int *)&local_78
            );
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/connormanning[P]arbiter/test/unit.cpp"
               ,0x34,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  return;
}

Assistant:

TEST(Arbiter, Time)
{
    Time a;
    Time b(a.str());

    EXPECT_EQ(a.str(), b.str());
    EXPECT_EQ(a - b, 0);

    Time x("2016-03-18T03:14:42Z");
    Time y("2016-03-18T04:24:54Z");
    const int64_t delta(1 * 60 * 60 + 10 * 60 + 12);

    EXPECT_EQ(y - x, delta);
    EXPECT_EQ(x - y, -delta);

    Time epoch("1970-01-01T00:00:00Z");
    EXPECT_EQ(epoch.asUnix(), 0);

    // Issue 23.
    {
        Time t("2019-01-03T17:39:11Z");
        EXPECT_EQ(t.asUnix() - 1546537151, 0);
    }
}